

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Comment_PDU::SetFixedDatum
          (Comment_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
          *FD)

{
  size_type sVar1;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
  *FD_local;
  Comment_PDU *this_local;
  
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength -
       (short)(this->m_ui32NumFixedDatum << 3);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
  ::operator=(&this->m_vFixedDatum,FD);
  sVar1 = std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
          ::size(&this->m_vFixedDatum);
  this->m_ui32NumFixedDatum = (KUINT32)sVar1;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength +
       (short)(this->m_ui32NumFixedDatum << 3);
  return;
}

Assistant:

void Comment_PDU::SetFixedDatum( const vector<FixDtmPtr> & FD )
{
    // Subtract old length
    m_ui16PDULength -= m_ui32NumFixedDatum * FixedDatum::FIXED_DATUM_SIZE;

    m_vFixedDatum = FD;
    m_ui32NumFixedDatum = m_vFixedDatum.size();

    // Calculate new length
    m_ui16PDULength += m_ui32NumFixedDatum * FixedDatum::FIXED_DATUM_SIZE;
}